

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_bitshift(ASMState *as,IRIns *ir,x86Shift xs)

{
  byte bVar1;
  MCode *pMVar2;
  Reg r2;
  int iVar3;
  Reg ref;
  int in_EDX;
  long in_RSI;
  ASMState *in_RDI;
  Reg right;
  int shift;
  Reg dest;
  IRIns *irr;
  IRRef rref;
  undefined4 in_stack_ffffffffffffffc8;
  RegSet in_stack_ffffffffffffffcc;
  RegSet in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint in_stack_ffffffffffffffd8;
  IRIns *as_00;
  
  as_00 = in_RDI->ir + (uint)*(ushort *)(in_RSI + 2);
  if (*(ushort *)(in_RSI + 2) < 0x8000) {
    r2 = ra_dest((ASMState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (IRIns *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
    in_stack_ffffffffffffffd8 =
         (as_00->field_1).op12 &
         ((uint)((0x604208U >> (*(uint *)(in_RSI + 4) & 0x1f) & 1) != 0) << 5 | 0x1f);
    if (in_stack_ffffffffffffffd8 != 0) {
      if (in_stack_ffffffffffffffd8 == 1) {
        iVar3 = 0;
        if ((0x604208U >> (*(byte *)(in_RSI + 4) & 0x1f) & 1) != 0) {
          iVar3 = 0x80200;
        }
        emit_rr(in_RDI,XO_SHIFT1,in_EDX + iVar3,r2);
      }
      else {
        pMVar2 = in_RDI->mcp;
        in_RDI->mcp = pMVar2 + -1;
        pMVar2[-1] = (MCode)in_stack_ffffffffffffffd8;
        iVar3 = 0;
        if ((0x604208U >> (*(byte *)(in_RSI + 4) & 0x1f) & 1) != 0) {
          iVar3 = 0x80200;
        }
        emit_rr(in_RDI,XO_SHIFTi,in_EDX + iVar3,r2);
      }
    }
  }
  else {
    r2 = ra_dest((ASMState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (IRIns *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
    if (r2 == 1) {
      r2 = ra_scratch((ASMState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffcc);
      emit_rr(in_RDI,XO_MOV,1,r2);
    }
    bVar1 = (as_00->field_1).r;
    ref = (Reg)bVar1;
    if ((bVar1 & 0x80) == 0) {
      if (ref != 1) {
        ra_scratch((ASMState *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc);
      }
    }
    else {
      ref = ra_allocref((ASMState *)CONCAT44(r2,in_stack_ffffffffffffffd8),ref,
                        in_stack_ffffffffffffffd0);
    }
    iVar3 = 0;
    if ((0x604208U >> (*(byte *)(in_RSI + 4) & 0x1f) & 1) != 0) {
      iVar3 = 0x80200;
    }
    emit_rr(in_RDI,XO_SHIFTcl,in_EDX + iVar3,r2);
    in_RDI->weakset = (1 << ((byte)ref & 0x1f) ^ 0xffffffffU) & in_RDI->weakset;
    if (ref != 1) {
      emit_rr(in_RDI,XO_MOV,1,ref);
    }
  }
  ra_left((ASMState *)&as_00->field_0,r2,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

static void asm_bitshift(ASMState *as, IRIns *ir, x86Shift xs)
{
  IRRef rref = ir->op2;
  IRIns *irr = IR(rref);
  Reg dest;
  if (irref_isk(rref)) {  /* Constant shifts. */
    int shift;
    dest = ra_dest(as, ir, RSET_GPR);
    shift = irr->i & (irt_is64(ir->t) ? 63 : 31);
    switch (shift) {
    case 0: break;
    case 1: emit_rr(as, XO_SHIFT1, REX_64IR(ir, xs), dest); break;
    default: emit_shifti(as, REX_64IR(ir, xs), dest, shift); break;
    }
  } else {  /* Variable shifts implicitly use register cl (i.e. ecx). */
    Reg right;
    dest = ra_dest(as, ir, rset_exclude(RSET_GPR, RID_ECX));
    if (dest == RID_ECX) {
      dest = ra_scratch(as, rset_exclude(RSET_GPR, RID_ECX));
      emit_rr(as, XO_MOV, RID_ECX, dest);
    }
    right = irr->r;
    if (ra_noreg(right))
      right = ra_allocref(as, rref, RID2RSET(RID_ECX));
    else if (right != RID_ECX)
      ra_scratch(as, RID2RSET(RID_ECX));
    emit_rr(as, XO_SHIFTcl, REX_64IR(ir, xs), dest);
    ra_noweak(as, right);
    if (right != RID_ECX)
      emit_rr(as, XO_MOV, RID_ECX, right);
  }
  ra_left(as, dest, ir->op1);
  /*
  ** Note: avoid using the flags resulting from a shift or rotate!
  ** All of them cause a partial flag stall, except for r,1 shifts
  ** (but not rotates). And a shift count of 0 leaves the flags unmodified.
  */
}